

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dup_mem_vec_mips64
               (TCGContext_conflict5 *tcg_ctx,uint vece,TCGv_vec r,TCGv_ptr b,tcg_target_long ofs)

{
  vec_gen_3_mips64(tcg_ctx,INDEX_op_dupm_vec,
                   (uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r],vece,
                   (TCGArg)(r + (long)&tcg_ctx->pool_cur),(TCGArg)(b + (long)tcg_ctx),ofs);
  return;
}

Assistant:

void tcg_gen_dup_mem_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_ptr b,
                         tcg_target_long ofs)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_3(tcg_ctx, INDEX_op_dupm_vec, type, vece, ri, bi, ofs);
}